

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptArrays.cpp
# Opt level: O1

void __thiscall GlobOpt::ArraySrcOpt::InsertHeadSegmentLoad(ArraySrcOpt *this)

{
  undefined1 *puVar1;
  undefined2 valueType;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  ObjectType OVar6;
  uint uVar7;
  uint uVar8;
  DWORD offset;
  uint32 offset_00;
  JITTimeFunctionBody *pJVar9;
  FunctionJITTimeInfo *pFVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  undefined4 *puVar13;
  RegOpnd *this_00;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar14;
  Instr *this_01;
  Instr *this_02;
  char16_t *this_03;
  RegOpnd *baseOpnd_00;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ArraySegmentHoistPhase,uVar7,uVar8);
  if (bVar4) {
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_88);
    Output::Print(L"Function %s (%s)",pcVar11,pcVar12);
    bVar4 = JITTimeWorkItem::IsLoopBody(this->func->m_workItem);
    if (bVar4) {
      uVar7 = JITTimeWorkItem::GetLoopNumber(this->func->m_workItem);
      Output::Print(L", loop %u",(ulong)uVar7);
    }
    pFVar2 = (*this->instr)->m_func;
    if (pFVar2 != this->func) {
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody(pFVar2->m_workItem);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar9);
      pFVar10 = JITTimeWorkItem::GetJITTimeInfo((*this->instr)->m_func->m_workItem);
      pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_88);
      Output::Print(L", Inlinee %s (%s)",pcVar11,pcVar12);
    }
    Output::Print(L" - %s\n    ",L"ArraySegmentHoist");
    IR::Instr::Dump(*this->instr);
    Output::Print(L"    ");
    Output::Print(L"Separating array segment load\n");
    Output::Flush();
  }
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,ArraySegmentHoistPhase,uVar7,uVar8);
  if (bVar4) {
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody((*this->instr)->m_func->m_workItem);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo((*this->instr)->m_func->m_workItem);
    pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_88);
    Output::Print(L"Testtrace: %s function %s (%s): ",L"ArraySegmentHoist",pcVar11,pcVar12);
    Output::Print(L"Separating array segment load\n");
    Output::Flush();
  }
  if (this->newHeadSegmentSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0x648,"(newHeadSegmentSym)","newHeadSegmentSym");
    if (!bVar4) goto LAB_0048ccbb;
    *puVar13 = 0;
  }
  this_00 = IR::RegOpnd::New(this->newHeadSegmentSym,this->newHeadSegmentSym->m_type,
                             (*this->instr)->m_func);
  IR::Opnd::SetIsJITOptimizedReg(&this_00->super_Opnd,true);
  baseOpnd = (RegOpnd *)IR::Opnd::Copy(&this->baseOpnd->super_Opnd,(*this->instr)->m_func);
  OVar5 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_0048ccbb;
    *puVar13 = 0;
  }
  IR::Opnd::SetIsJITOptimizedReg((Opnd *)baseOpnd,true);
  OVar6 = ValueType::GetObjectType(&this->baseValueType);
  if (OVar6 == ObjectWithArray) {
    offset = Js::DynamicObject::GetOffsetOfObjectArray();
    pIVar14 = IR::IndirOpnd::New(baseOpnd,offset,(baseOpnd->super_Opnd).m_type,
                                 (*this->instr)->m_func,false);
    this_01 = IR::Instr::New(LdIndir,&this_00->super_Opnd,&pIVar14->super_Opnd,
                             (*this->instr)->m_func);
  }
  else {
    this_01 = (Instr *)0x0;
  }
  baseOpnd_00 = this_00;
  if (this_01 == (Instr *)0x0) {
    baseOpnd_00 = baseOpnd;
  }
  valueType = this->baseValueType;
  offset_00 = Lowerer::GetArrayOffsetOfHeadSegment((ValueType)valueType);
  pIVar14 = IR::IndirOpnd::New(baseOpnd_00,offset_00,(this_00->super_Opnd).m_type,
                               (*this->instr)->m_func,false);
  this_02 = IR::Instr::New(LdIndir,&this_00->super_Opnd,&pIVar14->super_Opnd,(*this->instr)->m_func)
  ;
  if (this->hoistHeadSegmentLoadOutOfLoop == (Loop *)0x0) {
    if (this_01 != (Instr *)0x0) {
      IR::Instr::SetByteCodeOffset(this_01,*this->instr);
      IR::Instr::InsertBefore(this->insertBeforeInstr,this_01);
    }
    IR::Instr::SetByteCodeOffset(this_02,*this->instr);
    IR::Instr::InsertBefore(this->insertBeforeInstr,this_02);
    puVar1 = &(*this->instr)->field_0x36;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x400;
  }
  else {
    if ((this->isLikelyJsArray == true) &&
       (((this->hoistHeadSegmentLoadOutOfLoop->jsArrayKills).field_0.bits & 0x10) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x66f,
                         "(!(isLikelyJsArray && hoistHeadSegmentLoadOutOfLoop->jsArrayKills.KillsArrayHeadSegments()))"
                         ,
                         "!(isLikelyJsArray && hoistHeadSegmentLoadOutOfLoop->jsArrayKills.KillsArrayHeadSegments())"
                        );
      if (!bVar4) {
LAB_0048ccbb:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar13 = 0;
    }
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ArraySegmentHoistPhase,uVar7,uVar8);
    if (bVar4) {
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar9);
      pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_88);
      Output::Print(L"Function %s (%s)",pcVar11,pcVar12);
      bVar4 = JITTimeWorkItem::IsLoopBody(this->func->m_workItem);
      if (bVar4) {
        uVar7 = JITTimeWorkItem::GetLoopNumber(this->func->m_workItem);
        Output::Print(L", loop %u",(ulong)uVar7);
      }
      pFVar2 = (*this->instr)->m_func;
      if (pFVar2 != this->func) {
        pJVar9 = JITTimeWorkItem::GetJITFunctionBody(pFVar2->m_workItem);
        pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar9);
        pFVar10 = JITTimeWorkItem::GetJITTimeInfo((*this->instr)->m_func->m_workItem);
        pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_88);
        Output::Print(L", Inlinee %s (%s)",pcVar11,pcVar12);
      }
      Output::Print(L" - %s\n    ",L"ArraySegmentHoist");
      IR::Instr::Dump(*this->instr);
      Output::Print(L"    ");
      uVar7 = Loop::GetLoopNumber(this->hoistHeadSegmentLoadOutOfLoop);
      Output::Print(L"Hoisting array segment load out of loop %u to landing pad block %u\n",
                    (ulong)uVar7,(ulong)this->hoistHeadSegmentLoadOutOfLoop->landingPad->number);
      Output::Flush();
    }
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
    this_03 = (char16_t *)&DAT_015d3490;
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,ArraySegmentHoistPhase,uVar7,uVar8);
    if (bVar4) {
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody((*this->instr)->m_func->m_workItem);
      pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar9);
      pFVar10 = JITTimeWorkItem::GetJITTimeInfo((*this->instr)->m_func->m_workItem);
      pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_88);
      Output::Print(L"Testtrace: %s function %s (%s): ",L"ArraySegmentHoist",pcVar11,pcVar12);
      this_03 = L"Hoisting array segment load out of loop\n";
      Output::Print(L"Hoisting array segment load out of loop\n");
      Output::Flush();
    }
    if (this_01 != (Instr *)0x0) {
      InsertInstrInLandingPad((ArraySrcOpt *)this_03,this_01,this->hoistHeadSegmentLoadOutOfLoop);
    }
    InsertInstrInLandingPad((ArraySrcOpt *)this_03,this_02,this->hoistHeadSegmentLoadOutOfLoop);
  }
  return;
}

Assistant:

void GlobOpt::ArraySrcOpt::InsertHeadSegmentLoad()
{
    TRACE_TESTTRACE_PHASE_INSTR(Js::ArraySegmentHoistPhase, instr, _u("Separating array segment load\n"));

    Assert(newHeadSegmentSym);
    IR::RegOpnd *const headSegmentOpnd = IR::RegOpnd::New(newHeadSegmentSym, newHeadSegmentSym->GetType(), instr->m_func);
    headSegmentOpnd->SetIsJITOptimizedReg(true);

    IR::RegOpnd *const jitOptimizedBaseOpnd = baseOpnd->Copy(instr->m_func)->AsRegOpnd();
    jitOptimizedBaseOpnd->SetIsJITOptimizedReg(true);

    IR::Instr *loadObjectArray;
    if (baseValueType.GetObjectType() == ObjectType::ObjectWithArray)
    {
        loadObjectArray =
            IR::Instr::New(
                Js::OpCode::LdIndir,
                headSegmentOpnd,
                IR::IndirOpnd::New(
                    jitOptimizedBaseOpnd,
                    Js::DynamicObject::GetOffsetOfObjectArray(),
                    jitOptimizedBaseOpnd->GetType(),
                    instr->m_func),
                instr->m_func);
    }
    else
    {
        loadObjectArray = nullptr;
    }

    IR::Instr *const loadHeadSegment =
        IR::Instr::New(
            Js::OpCode::LdIndir,
            headSegmentOpnd,
            IR::IndirOpnd::New(
                loadObjectArray ? headSegmentOpnd : jitOptimizedBaseOpnd,
                Lowerer::GetArrayOffsetOfHeadSegment(baseValueType),
                headSegmentOpnd->GetType(),
                instr->m_func),
            instr->m_func);

    if (hoistHeadSegmentLoadOutOfLoop)
    {
        Assert(!(isLikelyJsArray && hoistHeadSegmentLoadOutOfLoop->jsArrayKills.KillsArrayHeadSegments()));

        TRACE_PHASE_INSTR(
            Js::ArraySegmentHoistPhase,
            instr,
            _u("Hoisting array segment load out of loop %u to landing pad block %u\n"),
            hoistHeadSegmentLoadOutOfLoop->GetLoopNumber(),
            hoistHeadSegmentLoadOutOfLoop->landingPad->GetBlockNum());

        TESTTRACE_PHASE_INSTR(Js::ArraySegmentHoistPhase, instr, _u("Hoisting array segment load out of loop\n"));

        if (loadObjectArray)
        {
            InsertInstrInLandingPad(loadObjectArray, hoistHeadSegmentLoadOutOfLoop);
        }

        InsertInstrInLandingPad(loadHeadSegment, hoistHeadSegmentLoadOutOfLoop);
    }
    else
    {
        if (loadObjectArray)
        {
            loadObjectArray->SetByteCodeOffset(instr);
            insertBeforeInstr->InsertBefore(loadObjectArray);
        }

        loadHeadSegment->SetByteCodeOffset(instr);
        insertBeforeInstr->InsertBefore(loadHeadSegment);
        instr->loadedArrayHeadSegment = true;
    }
}